

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2skini.cpp
# Opt level: O0

void printMidiAsSkini(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  MidiEvent *mfevent;
  undefined1 local_68 [8];
  MidiEvent event;
  int oldticks;
  int i;
  double curtime;
  double tempo;
  int ticks;
  int tpq;
  MidiFile *midifile_local;
  
  _ticks = midifile;
  tempo._4_4_ = smf::MidiFile::getTicksPerQuarterNote(midifile);
  tempo._0_4_ = 0;
  curtime = 120.0;
  _oldticks = 0.0;
  event.m_eventlink._4_4_ = 0;
  while( true ) {
    iVar1 = event.m_eventlink._4_4_;
    iVar2 = smf::MidiFile::getNumEvents(_ticks,0);
    if (iVar2 <= iVar1) break;
    event.m_eventlink._0_4_ = tempo._0_4_;
    mfevent = smf::MidiFile::getEvent(_ticks,0,event.m_eventlink._4_4_);
    smf::MidiEvent::MidiEvent((MidiEvent *)local_68,mfevent);
    tempo._0_4_ = (int)event.super_MidiMessage.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
    if (0 < event.m_eventlink._4_4_) {
      _oldticks = (((double)((int)event.super_MidiMessage.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (int)event.m_eventlink) * 60.0) / curtime) / (double)tempo._4_4_ +
                  _oldticks;
    }
    processEvent((MidiEvent *)local_68,&curtime,(double *)&oldticks);
    smf::MidiEvent::~MidiEvent((MidiEvent *)local_68);
    event.m_eventlink._4_4_ = event.m_eventlink._4_4_ + 1;
  }
  return;
}

Assistant:

void printMidiAsSkini(MidiFile& midifile) {
   int       tpq      = midifile.getTicksPerQuarterNote();
   int       ticks    = 0;     // absolute ticks of current event
   double    tempo    = 120.0; // time units will be in seconds
   double    curtime  = 0.0;   // current time in seconds
   int       i;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      int oldticks = ticks;
      MidiEvent event = midifile.getEvent(0, i);
      ticks = event.tick;
      if (i>0) {
         curtime += (ticks - oldticks) * 60.0 / tempo / tpq;
      }
      processEvent(event, tempo, curtime);
   }
}